

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-utils.c
# Opt level: O3

int coda_path_from_path(char *initialpath,int is_filepath,char *appendpath,char **resultpath)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  size_t sVar6;
  byte *__dest;
  uint uVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  byte *pbVar11;
  
  uVar5 = strlen(initialpath);
  if (appendpath == (char *)0x0) {
    uVar8 = 0;
  }
  else {
    sVar6 = strlen(appendpath);
    uVar8 = (uint)sVar6;
  }
  if (0 < (int)(uint)uVar5 && is_filepath != 0) {
    uVar5 = (ulong)((uint)uVar5 & 0x7fffffff);
    do {
      if ((initialpath[uVar5 - 1] == '/') || (initialpath[uVar5 - 1] == '\\')) goto LAB_00137dc1;
      bVar3 = 1 < (long)uVar5;
      uVar5 = uVar5 - 1;
    } while (bVar3);
    uVar5 = 0;
  }
LAB_00137dc1:
  __dest = (byte *)malloc((long)(int)(uVar8 + (int)uVar5 + 2));
  *resultpath = (char *)__dest;
  if (__dest == (byte *)0x0) {
    coda_set_error(-1,"out of memory (could not duplicate string) (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-utils.c"
                   ,0x1e1);
    return -1;
  }
  if ((int)uVar5 < 1) {
    pbVar11 = __dest;
    if ((int)uVar8 < 1) goto LAB_00137e4b;
  }
  else {
    memcpy(__dest,initialpath,uVar5 & 0xffffffff);
    pbVar11 = __dest + (uVar5 & 0xffffffff);
    if ((int)uVar8 < 1) goto LAB_00137e4b;
    *pbVar11 = 0x2f;
    pbVar11 = pbVar11 + 1;
  }
  memcpy(pbVar11,appendpath,(ulong)uVar8);
  pbVar11 = pbVar11 + uVar8;
LAB_00137e4b:
  *pbVar11 = 0;
  bVar1 = *__dest;
  uVar8 = (uint)bVar1;
  if (bVar1 != 0) {
    uVar5 = 0;
    if (bVar1 == 0x2e) {
      uVar10 = 0;
      do {
        uVar5 = uVar10;
        if (__dest[uVar10 + 1] != 0x2f) break;
        uVar5 = uVar10 + 2;
        lVar9 = uVar10 + 2;
        uVar10 = uVar5;
      } while (__dest[lVar9] == 0x2e);
    }
    uVar8 = 0;
LAB_00137e80:
    uVar4 = uVar8;
    lVar9 = (long)(int)uVar5;
    bVar1 = __dest[lVar9];
    if ((bVar1 == 0x2f) || (bVar1 == 0x5c)) goto LAB_00137e95;
    if (bVar1 != 0) {
      uVar7 = (int)uVar5 + 1;
      goto LAB_00137f1d;
    }
    if (uVar4 == 0) {
      *__dest = 0x2e;
      uVar4 = 1;
    }
    __dest[(int)uVar4] = 0;
    uVar8 = 0;
  }
  return uVar8;
LAB_00137e95:
  uVar10 = lVar9 + 1;
  uVar7 = (uint)uVar10;
  bVar2 = __dest[lVar9 + 1];
  uVar5 = uVar10 & 0xffffffff;
  uVar8 = uVar4;
  if ((bVar2 == 0x5c) || (uVar5 = uVar10 & 0xffffffff, bVar2 == 0x2f)) goto LAB_00137e80;
  if (bVar2 == 0x2e) {
    uVar5 = lVar9 + 2;
    bVar2 = __dest[lVar9 + 2];
    if (bVar2 < 0x2f) {
      if (bVar2 == 0) goto LAB_00137e80;
      if ((bVar2 == 0x2e) &&
         (((bVar2 = __dest[lVar9 + 3], bVar2 == 0 || (bVar2 == 0x2f)) || (bVar2 == 0x5c)))) {
        uVar10 = (ulong)uVar4;
        if ((((int)uVar4 < 2) || (__dest[uVar10 - 1] != 0x2e)) || (__dest[uVar10 - 2] != 0x2e)) {
LAB_00137f3b:
          uVar5 = lVar9 + 3U & 0xffffffff;
          do {
            uVar10 = uVar10 - 1;
            if ((int)uVar8 < 1) goto LAB_00137f1d;
            uVar8 = uVar8 - 1;
          } while ((__dest[uVar10 & 0xffffffff] != 0x2f) && (__dest[uVar10 & 0xffffffff] != 0x5c));
          goto LAB_00137e80;
        }
        if (uVar4 == 2) {
          uVar4 = 2;
        }
        else if ((__dest[uVar10 - 3] != 0x2f) && (__dest[uVar10 - 3] != 0x5c)) goto LAB_00137f3b;
      }
    }
    else if ((bVar2 == 0x2f) || (bVar2 == 0x5c)) goto LAB_00137e80;
  }
LAB_00137f1d:
  __dest[(int)uVar4] = bVar1;
  uVar5 = (ulong)uVar7;
  uVar8 = uVar4 + 1;
  goto LAB_00137e80;
}

Assistant:

int coda_path_from_path(const char *initialpath, int is_filepath, const char *appendpath, char **resultpath)
{
    char *path;
    int initialpath_length;
    int appendpath_length;

    initialpath_length = (int)strlen(initialpath);
    appendpath_length = (appendpath == NULL ? 0 : (int)strlen(appendpath));

    if (is_filepath && initialpath_length > 0)
    {
        /* remove trailing parth */
        while (initialpath_length > 0 && initialpath[initialpath_length - 1] != '/' &&
               initialpath[initialpath_length - 1] != '\\')
        {
            initialpath_length--;
        }
    }

    *resultpath = malloc(initialpath_length + 1 + appendpath_length + 1);
    if (*resultpath == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not duplicate string) (%s:%u)", __FILE__,
                       __LINE__);
        return -1;
    }
    path = *resultpath;
    if (initialpath_length > 0)
    {
        memcpy(path, initialpath, initialpath_length);
        path += initialpath_length;
        if (appendpath_length > 0)
        {
            *path = '/';
            path++;
        }
    }
    if (appendpath_length > 0)
    {
        memcpy(path, appendpath, appendpath_length);
        path += appendpath_length;
    }
    *path = '\0';

    clean_path(*resultpath);

    return 0;
}